

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O0

ze_result_t __thiscall
loader::context_t::check_drivers
          (context_t *this,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool *requireDdiReinit,bool sysmanOnly)

{
  byte bVar1;
  bool bVar2;
  ze_result_t result_00;
  size_type sVar3;
  pointer pdVar4;
  reference driver;
  size_type sVar5;
  const_iterator local_3e8;
  driver_t *local_3e0;
  loader local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [8];
  string errorMessage;
  string local_310 [4];
  ze_result_t result;
  string freeLibraryErrorValue;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_2f0;
  __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
  local_2e8;
  iterator it;
  driver_vector_t *pdStack_2d8;
  bool pciOrderingRequested;
  driver_vector_t *drivers;
  string local_2c8 [8];
  string initName;
  allocator local_2a1;
  string local_2a0 [6];
  bool return_first_driver_result;
  string local_280 [39];
  allocator local_259;
  string local_258 [8];
  string message_2;
  allocator local_231;
  string local_230 [32];
  string local_210 [32];
  loader local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [8];
  string message_1;
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  loader local_100 [55];
  allocator local_c9;
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string message;
  bool sysmanOnly_local;
  bool *requireDdiReinit_local;
  zes_global_dditable_t *sysmanGlobalInitStored_local;
  ze_global_dditable_t *globalInitStored_local;
  ze_init_driver_type_desc_t *desc_local;
  ze_init_flags_t flags_local;
  context_t *this_local;
  
  if ((this->debugTraceEnabled & 1U) != 0) {
    if (desc == (ze_init_driver_type_desc_t *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c8,"flags=",&local_1c9);
      std::operator+((char *)local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "check_drivers(");
      to_string_abi_cxx11_(local_1f0,flags);
      std::operator+(local_188,local_1a8);
      std::operator+(local_168,(char *)local_188);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::string::~string(local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      std::__cxx11::string::string(local_210,(string *)local_168);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,"",&local_231);
      debug_trace_message(this,(string *)local_210,(string *)local_230);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string((string *)local_168);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"desc->flags=",&local_c9);
      std::operator+((char *)local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "check_drivers(");
      to_string_abi_cxx11_(local_100,desc);
      std::operator+(local_88,local_a8);
      std::operator+(local_68,(char *)local_88);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)local_100);
      std::__cxx11::string::~string((string *)local_a8);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      std::__cxx11::string::string(local_120,(string *)local_68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"",&local_141);
      debug_trace_message(this,(string *)local_120,(string *)local_140);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  if ((desc == (ze_init_driver_type_desc_t *)0x0) || ((*(byte *)(context + 0x162a) & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"zeInit",(allocator *)((long)&drivers + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&drivers + 7));
    pdStack_2d8 = &this->zeDrivers;
    if (desc != (ze_init_driver_type_desc_t *)0x0) {
      std::__cxx11::string::operator=(local_2c8,"zeInitDrivers");
    }
    if (sysmanOnly) {
      pdStack_2d8 = &this->zesDrivers;
      std::__cxx11::string::operator=(local_2c8,"zesInit");
    }
    sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size(pdStack_2d8);
    it._M_current._7_1_ = getenv_tobool("ZE_ENABLE_PCI_ID_DEVICE_ORDER");
    bVar2 = getenv_tobool("ZET_ENABLE_PROGRAM_INSTRUMENTATION");
    *(bool *)(context + 0x165d) = bVar2;
    local_2e8._M_current =
         (driver_t *)
         std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(pdStack_2d8);
    do {
      local_2f0._M_current =
           (driver_t *)
           std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(pdStack_2d8);
      bVar2 = __gnu_cxx::operator!=(&local_2e8,&local_2f0);
      bVar1 = it._M_current._7_1_;
      if (!bVar2) {
        sVar3 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size(pdStack_2d8);
        if (sVar3 == 0) {
          this_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
        }
        else {
          this_local._4_4_ = ZE_RESULT_SUCCESS;
        }
        break;
      }
      pdVar4 = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator->(&local_2e8);
      pdVar4->pciOrderingRequested = (bool)(bVar1 & 1);
      std::__cxx11::string::string(local_310);
      driver = __gnu_cxx::
               __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
               ::operator*(&local_2e8);
      result_00 = init_driver(this,driver,flags,desc,globalInitStored,sysmanGlobalInitStored,
                              sysmanOnly);
      if (result_00 == ZE_RESULT_SUCCESS) {
        pdVar4 = __gnu_cxx::
                 __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                 ::operator->(&local_2e8);
        pdVar4->driverInuse = true;
        __gnu_cxx::
        __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
        ::operator++(&local_2e8,0);
LAB_0043781d:
        bVar2 = false;
      }
      else {
        pdVar4 = __gnu_cxx::
                 __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                 ::operator->(&local_2e8);
        if (((pdVar4->driverInuse & 1U) == 0) && ((*(byte *)(context + 0x162a) & 1) == 0)) {
          if ((this->debugTraceEnabled & 1U) != 0) {
            __gnu_cxx::
            __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
            ::operator->(&local_2e8);
            std::operator+((char *)local_398,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Check Drivers Failed on ");
            std::operator+(local_378,(char *)local_398);
            std::operator+(local_358,local_378);
            std::operator+(local_338,(char *)local_358);
            std::__cxx11::string::~string((string *)local_358);
            std::__cxx11::string::~string((string *)local_378);
            std::__cxx11::string::~string(local_398);
            std::__cxx11::string::string(local_3b8,(string *)local_338);
            to_string_abi_cxx11_(local_3d8,result_00);
            debug_trace_message(this,(string *)local_3b8,(string *)local_3d8);
            std::__cxx11::string::~string((string *)local_3d8);
            std::__cxx11::string::~string(local_3b8);
            std::__cxx11::string::~string((string *)local_338);
          }
          __gnu_cxx::
          __normal_iterator<loader::driver_t_const*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>
          ::__normal_iterator<loader::driver_t*>
                    ((__normal_iterator<loader::driver_t_const*,std::vector<loader::driver_t,std::allocator<loader::driver_t>>>
                      *)&local_3e8,&local_2e8);
          local_3e0 = (driver_t *)
                      std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::erase
                                (pdStack_2d8,local_3e8);
          local_2e8._M_current = local_3e0;
          sVar5 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                            (pdStack_2d8);
          if ((sVar5 == 1) && ((*(byte *)(context + 0x1629) & 1) == 0)) {
            *requireDdiReinit = true;
          }
        }
        else {
          __gnu_cxx::
          __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
          ::operator++(&local_2e8,0);
        }
        if (sVar3 != 1) goto LAB_0043781d;
        bVar2 = true;
        this_local._4_4_ = result_00;
      }
      std::__cxx11::string::~string(local_310);
    } while (!bVar2);
    std::__cxx11::string::~string(local_2c8);
  }
  else {
    if ((this->debugTraceEnabled & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_258,
                 "zeInitDrivers called first, but not supported by driver, returning uninitialized."
                 ,&local_259);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::__cxx11::string::string(local_280,local_258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"",&local_2a1);
      debug_trace_message(this,(string *)local_280,(string *)local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_258);
    }
    this_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t context_t::check_drivers(ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly) {
        if (debugTraceEnabled) {
            if (desc) {
                std::string message = "check_drivers(" + std::string("desc->flags=") + loader::to_string(desc) + ")";
                debug_trace_message(message, "");
            } else {
                std::string message = "check_drivers(" + std::string("flags=") + loader::to_string(flags) + ")";
                debug_trace_message(message, "");
            }
        }
        // If zeInitDrivers is not supported by this driver, but zeInitDrivers is called first, then return uninitialized.
        if (desc && !loader::context->initDriversSupport) {
            if (debugTraceEnabled) {
                std::string message = "zeInitDrivers called first, but not supported by driver, returning uninitialized.";
                debug_trace_message(message, "");
            }
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }


        bool return_first_driver_result=false;
        std::string initName = "zeInit";
        driver_vector_t *drivers = &zeDrivers;
        // If desc is set, then this is zeInitDrivers.
        if (desc) {
            initName = "zeInitDrivers";
        }
        // If this is sysmanOnly check_drivers, then zesInit is being called and we need to use zesDrivers.
        if (sysmanOnly) {
            drivers = &zesDrivers;
            initName = "zesInit";
        }
        if(drivers->size()==1) {
            return_first_driver_result=true;
        }
        bool pciOrderingRequested = getenv_tobool( "ZE_ENABLE_PCI_ID_DEVICE_ORDER" );
        loader::context->instrumentationEnabled = getenv_tobool( "ZET_ENABLE_PROGRAM_INSTRUMENTATION" );

        for(auto it = drivers->begin(); it != drivers->end(); )
        {
            it->pciOrderingRequested = pciOrderingRequested;
            std::string freeLibraryErrorValue;
            ze_result_t result = init_driver(*it, flags, desc, globalInitStored, sysmanGlobalInitStored, sysmanOnly);
            if(result != ZE_RESULT_SUCCESS) {
                // If the driver has already been init and handles are to be read, then this driver cannot be removed from the list.
                // Also, if any driver supports zeInitDrivers, then no driver can be removed to allow for different sets of drivers.
                if (!it->driverInuse && !loader::context->initDriversSupport) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "Check Drivers Failed on " + it->name + " , driver will be removed. " + initName + " failed with ";
                        debug_trace_message(errorMessage, loader::to_string(result));
                    }
                    it = drivers->erase(it);
                    // If the number of drivers is now ==1, then we need to reinit the ddi tables to pass through.
                    // If ZE_ENABLE_LOADER_INTERCEPT is set to 1, then even if drivers were removed, don't reinit the ddi tables.
                    if (drivers->size() == 1 && !loader::context->forceIntercept) {
                        *requireDdiReinit = true;
                    }
                } else {
                    it++;
                }
                if(return_first_driver_result)
                    return result;
            } else {
                // If this is a single driver system, then the first success for this driver needs to be set.
                it->driverInuse = true;
                it++;
            }
        }

        if(drivers->size() == 0)
            return ZE_RESULT_ERROR_UNINITIALIZED;

        return ZE_RESULT_SUCCESS;
    }